

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O3

void CoreML::Specification::protobuf_Parameters_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_003cb0d8 == '\x01') {
    DAT_003cb0d8 = '\0';
    (*(code *)*_Int64Parameter_default_instance_)();
  }
  if (DAT_003cb118 == '\x01') {
    DAT_003cb118 = '\0';
    (*(code *)*_DoubleParameter_default_instance_)();
  }
  if (DAT_003cb148 == '\x01') {
    DAT_003cb148 = '\0';
    (*(code *)*_StringParameter_default_instance_)();
  }
  if (DAT_003cb168 == '\x01') {
    DAT_003cb168 = 0;
    (*(code *)*_BoolParameter_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _Int64Parameter_default_instance_.Shutdown();
  _DoubleParameter_default_instance_.Shutdown();
  _StringParameter_default_instance_.Shutdown();
  _BoolParameter_default_instance_.Shutdown();
}